

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,int param_2,bool polish)

{
  double dVar1;
  char cVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined8 uVar5;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  ulong uVar12;
  int nr;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxabs;
  cpp_dec_float<50U,_int,_void> vv;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bestDelta;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sel;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  delta_shift;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowstab;
  int local_574;
  DataKey local_570;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_568;
  undefined4 local_52c;
  undefined8 local_528;
  uint auStack_520 [4];
  undefined5 uStack_510;
  undefined3 uStack_50b;
  undefined5 local_508;
  undefined3 uStack_503;
  int local_500;
  undefined1 local_4fc;
  undefined8 local_4f8;
  cpp_dec_float<50U,_int,_void> local_4e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4a8;
  cpp_dec_float<50U,_int,_void> local_468;
  cpp_dec_float<50U,_int,_void> local_428;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3b0;
  undefined8 local_3a8;
  uint auStack_3a0 [5];
  undefined3 uStack_38b;
  uint local_388;
  undefined3 uStack_383;
  int local_380;
  undefined1 local_37c;
  undefined8 local_378;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_368;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_328;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_570.info = 0;
  local_570.idx = -1;
  local_568.m_backend.fpclass = cpp_dec_float_finite;
  local_568.m_backend.prec_elem = 10;
  local_568.m_backend.data._M_elems[0] = 0;
  local_568.m_backend.data._M_elems[1] = 0;
  local_568.m_backend.data._M_elems[2] = 0;
  local_568.m_backend.data._M_elems[3] = 0;
  local_568.m_backend.data._M_elems[4] = 0;
  local_568.m_backend.data._M_elems[5] = 0;
  local_568.m_backend.data._M_elems._24_5_ = 0;
  local_568.m_backend.data._M_elems[7]._1_3_ = 0;
  local_568.m_backend.data._M_elems._32_5_ = 0;
  local_568.m_backend.data._M_elems[9]._1_3_ = 0;
  local_568.m_backend.exp = 0;
  local_568.m_backend.neg = false;
  local_3e8.m_backend.fpclass = cpp_dec_float_finite;
  local_3e8.m_backend.prec_elem = 10;
  local_3e8.m_backend.data._M_elems[0] = 0;
  local_3e8.m_backend.data._M_elems[1] = 0;
  local_3e8.m_backend.data._M_elems[2] = 0;
  local_3e8.m_backend.data._M_elems[3] = 0;
  local_3e8.m_backend.data._M_elems[4] = 0;
  local_3e8.m_backend.data._M_elems[5] = 0;
  local_3e8.m_backend.data._M_elems._24_5_ = 0;
  local_3e8.m_backend.data._M_elems[7]._1_3_ = 0;
  local_3e8.m_backend.data._M_elems._32_5_ = 0;
  local_3e8.m_backend.data._M_elems[9]._1_3_ = 0;
  local_3e8.m_backend.exp = 0;
  local_3e8.m_backend.neg = false;
  local_4f8._0_4_ = cpp_dec_float_finite;
  local_4f8._4_4_ = 10;
  local_528._0_4_ = 0;
  local_528._4_4_ = 0;
  auStack_520[0] = 0;
  auStack_520[1] = 0;
  auStack_520[2] = 0;
  auStack_520[3] = 0;
  uStack_510 = 0;
  uStack_50b = 0;
  local_508 = 0;
  uStack_503 = 0;
  local_500 = 0;
  local_4fc = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_528,0.0);
  peVar3 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  dVar1 = peVar3->s_epsilon_multiplier;
  uVar12 = -(ulong)(dVar1 == 1.0);
  local_378._0_4_ = cpp_dec_float_finite;
  local_378._4_4_ = 10;
  local_3a8._0_4_ = 0;
  local_3a8._4_4_ = 0;
  auStack_3a0[0] = 0;
  auStack_3a0[1] = 0;
  auStack_3a0[2] = 0;
  auStack_3a0[3] = 0;
  stack0xfffffffffffffc70 = 0;
  uStack_38b = 0;
  _local_388 = 0;
  uStack_383 = 0;
  local_380 = 0;
  local_37c = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_3a8,
             (double)(~uVar12 & (ulong)(dVar1 * 1e-05) | uVar12 & 0x3ee4f8b588e368f1));
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  resetTols(this);
  iVar8 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  cVar2 = *(char *)(CONCAT44(extraout_var,iVar8) + 0x670);
  peVar3 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  dVar1 = peVar3->s_epsilon_multiplier;
  uVar12 = -(ulong)(dVar1 == 1.0);
  local_68.m_backend.fpclass = cpp_dec_float_finite;
  local_68.m_backend.prec_elem = 10;
  local_68.m_backend.data._M_elems[0] = 0;
  local_68.m_backend.data._M_elems[1] = 0;
  local_68.m_backend.data._M_elems[2] = 0;
  local_68.m_backend.data._M_elems[3] = 0;
  local_68.m_backend.data._M_elems[4] = 0;
  local_68.m_backend.data._M_elems[5] = 0;
  local_68.m_backend.data._M_elems._24_5_ = 0;
  local_68.m_backend.data._M_elems[7]._1_3_ = 0;
  local_68.m_backend.data._M_elems._32_5_ = 0;
  local_68.m_backend._37_8_ = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_68,
             (double)(~uVar12 & (ulong)(dVar1 * 1e-10) | uVar12 & 0x3ddb7cdfd9d7bdbb));
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_3e8,0.0);
  pnVar10 = &this->epsilon;
  local_4e8.data._M_elems._32_8_ = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
  local_4e8.data._M_elems._0_8_ = *(undefined8 *)(this->epsilon).m_backend.data._M_elems;
  local_4e8.data._M_elems._8_8_ = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 2);
  local_4e8.data._M_elems._16_8_ = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 4);
  local_4e8.data._M_elems._24_8_ = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
  local_4e8.exp = (this->epsilon).m_backend.exp;
  local_4e8.neg = (this->epsilon).m_backend.neg;
  local_4e8.fpclass = (this->epsilon).m_backend.fpclass;
  local_4e8.prec_elem = (this->epsilon).m_backend.prec_elem;
  local_52c = (undefined4)CONCAT71(in_register_00000009,polish);
  local_3b0 = pnVar10;
  if ((local_4e8.fpclass == cpp_dec_float_NaN || (val->m_backend).fpclass == cpp_dec_float_NaN) ||
     (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                        (&val->m_backend,&local_4e8), iVar8 < 1)) {
    local_4e8.data._M_elems._32_8_ = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
    local_4e8.data._M_elems._0_8_ = *(undefined8 *)(pnVar10->m_backend).data._M_elems;
    local_4e8.data._M_elems._8_8_ = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 2);
    local_4e8.data._M_elems._16_8_ = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 4);
    local_4e8.data._M_elems._24_8_ = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
    local_4e8.exp = (this->epsilon).m_backend.exp;
    local_4e8.neg = (this->epsilon).m_backend.neg;
    local_4e8.fpclass = (this->epsilon).m_backend.fpclass;
    local_4e8.prec_elem = (this->epsilon).m_backend.prec_elem;
    if (local_4e8.data._M_elems[0] != 0 || local_4e8.fpclass != cpp_dec_float_finite) {
      local_4e8.neg = (bool)(local_4e8.neg ^ 1);
    }
    if (((local_4e8.fpclass != cpp_dec_float_NaN) && ((val->m_backend).fpclass != cpp_dec_float_NaN)
        ) && (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&val->m_backend,&local_4e8), iVar8 < 0)) {
      iVar8 = 0;
      bVar6 = (bool)(char)local_52c;
      do {
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_528,0.0);
        local_568.m_backend.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
        local_568.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((val->m_backend).data._M_elems + 2);
        local_568.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((val->m_backend).data._M_elems + 4);
        uVar5 = *(undefined8 *)((val->m_backend).data._M_elems + 6);
        local_568.m_backend.data._M_elems._24_5_ = SUB85(uVar5,0);
        local_568.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        uVar5 = *(undefined8 *)((val->m_backend).data._M_elems + 8);
        local_568.m_backend.data._M_elems._32_5_ = SUB85(uVar5,0);
        local_568.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        local_568.m_backend.exp = (val->m_backend).exp;
        local_568.m_backend.neg = (val->m_backend).neg;
        local_568.m_backend.fpclass = (val->m_backend).fpclass;
        local_568.m_backend.prec_elem = (val->m_backend).prec_elem;
        local_570 = (DataKey)minDelta(this,&local_574,&local_568,
                                      (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)&local_528);
        if (local_570.info == 0) goto LAB_002b2ad7;
        local_228.m_backend.data._M_elems[7]._1_3_ = local_568.m_backend.data._M_elems[7]._1_3_;
        local_228.m_backend.data._M_elems._24_5_ = local_568.m_backend.data._M_elems._24_5_;
        local_228.m_backend.data._M_elems[0] = local_568.m_backend.data._M_elems[0];
        local_228.m_backend.data._M_elems[1] = local_568.m_backend.data._M_elems[1];
        local_228.m_backend.data._M_elems[2] = local_568.m_backend.data._M_elems[2];
        local_228.m_backend.data._M_elems[3] = local_568.m_backend.data._M_elems[3];
        local_228.m_backend.data._M_elems[4] = local_568.m_backend.data._M_elems[4];
        local_228.m_backend.data._M_elems[5] = local_568.m_backend.data._M_elems[5];
        local_228.m_backend.data._M_elems[9]._1_3_ = local_568.m_backend.data._M_elems[9]._1_3_;
        local_228.m_backend.data._M_elems._32_5_ = local_568.m_backend.data._M_elems._32_5_;
        local_228.m_backend.exp = local_568.m_backend.exp;
        local_228.m_backend.neg = local_568.m_backend.neg;
        local_228.m_backend.fpclass = local_568.m_backend.fpclass;
        local_228.m_backend.prec_elem = local_568.m_backend.prec_elem;
        local_268.m_backend.data._M_elems[7]._1_3_ = uStack_50b;
        local_268.m_backend.data._M_elems._24_5_ = uStack_510;
        local_268.m_backend.data._M_elems[0] = (uint)local_528;
        local_268.m_backend.data._M_elems[1] = local_528._4_4_;
        local_268.m_backend.data._M_elems[2] = auStack_520[0];
        local_268.m_backend.data._M_elems[3] = auStack_520[1];
        local_268.m_backend.data._M_elems[4] = auStack_520[2];
        local_268.m_backend.data._M_elems[5] = auStack_520[3];
        local_268.m_backend.data._M_elems[9]._1_3_ = uStack_503;
        local_268.m_backend.data._M_elems._32_5_ = local_508;
        local_268.m_backend.exp = local_500;
        local_268.m_backend.neg = (bool)local_4fc;
        local_268.m_backend.fpclass = (fpclass_type)local_4f8;
        local_268.m_backend.prec_elem = local_4f8._4_4_;
        bVar7 = shortEnter(this,(SPxId *)&local_570,local_574,&local_228,&local_268);
        if (!bVar7) {
          local_428.fpclass = cpp_dec_float_finite;
          local_428.prec_elem = 10;
          local_428.data._M_elems[0] = 0;
          local_428.data._M_elems[1] = 0;
          local_428.data._M_elems[2] = 0;
          local_428.data._M_elems[3] = 0;
          local_428.data._M_elems[4] = 0;
          local_428.data._M_elems[5] = 0;
          local_428.data._M_elems._24_5_ = 0;
          local_428.data._M_elems[7]._1_3_ = 0;
          local_428.data._M_elems._32_5_ = 0;
          local_428.data._M_elems[9]._1_3_ = 0;
          local_428.exp = 0;
          local_428.neg = false;
          local_4a8.m_backend.fpclass = cpp_dec_float_finite;
          local_4a8.m_backend.prec_elem = 10;
          local_4a8.m_backend.data._M_elems[0] = 0;
          local_4a8.m_backend.data._M_elems[1] = 0;
          local_4a8.m_backend.data._M_elems[2] = 0;
          local_4a8.m_backend.data._M_elems[3] = 0;
          local_4a8.m_backend.data._M_elems[4] = 0;
          local_4a8.m_backend.data._M_elems[5] = 0;
          local_4a8.m_backend.data._M_elems._24_5_ = 0;
          local_4a8.m_backend.data._M_elems[7]._1_3_ = 0;
          local_4a8.m_backend.data._M_elems._32_5_ = 0;
          local_4a8.m_backend.data._M_elems[9]._1_3_ = 0;
          local_4a8.m_backend.exp = 0;
          local_4a8.m_backend.neg = false;
          local_2a8.m_backend.data._M_elems[7]._1_3_ = uStack_50b;
          local_2a8.m_backend.data._M_elems._24_5_ = uStack_510;
          local_2a8.m_backend.data._M_elems[0] = (uint)local_528;
          local_2a8.m_backend.data._M_elems[1] = local_528._4_4_;
          local_2a8.m_backend.data._M_elems[2] = auStack_520[0];
          local_2a8.m_backend.data._M_elems[3] = auStack_520[1];
          local_2a8.m_backend.data._M_elems[4] = auStack_520[2];
          local_2a8.m_backend.data._M_elems[5] = auStack_520[3];
          local_2a8.m_backend.data._M_elems[9]._1_3_ = uStack_503;
          local_2a8.m_backend.data._M_elems._32_5_ = local_508;
          local_2a8.m_backend.exp = local_500;
          local_2a8.m_backend.neg = (bool)local_4fc;
          local_2a8.m_backend.fpclass = (fpclass_type)local_4f8;
          local_2a8.m_backend.prec_elem = local_4f8._4_4_;
          minStability((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_4e8,this,&local_2a8);
          local_4a8.m_backend.data._M_elems._32_5_ = local_4e8.data._M_elems._32_5_;
          local_4a8.m_backend.data._M_elems[9]._1_3_ = local_4e8.data._M_elems[9]._1_3_;
          local_4a8.m_backend.data._M_elems[4] = local_4e8.data._M_elems[4];
          local_4a8.m_backend.data._M_elems[5] = local_4e8.data._M_elems[5];
          local_4a8.m_backend.data._M_elems._24_5_ = local_4e8.data._M_elems._24_5_;
          local_4a8.m_backend.data._M_elems[7]._1_3_ = local_4e8.data._M_elems[7]._1_3_;
          local_4a8.m_backend.data._M_elems[0] = local_4e8.data._M_elems[0];
          local_4a8.m_backend.data._M_elems[1] = local_4e8.data._M_elems[1];
          local_4a8.m_backend.data._M_elems[2] = local_4e8.data._M_elems[2];
          local_4a8.m_backend.data._M_elems[3] = local_4e8.data._M_elems[3];
          local_4a8.m_backend.exp = local_4e8.exp;
          local_4a8.m_backend.neg = local_4e8.neg;
          local_4a8.m_backend.fpclass = local_4e8.fpclass;
          local_4a8.m_backend.prec_elem = local_4e8.prec_elem;
          if (cVar2 == '\0') {
            local_328.m_backend.data._M_elems[9]._1_3_ = local_568.m_backend.data._M_elems[9]._1_3_;
            local_328.m_backend.data._M_elems._32_5_ = local_568.m_backend.data._M_elems._32_5_;
            local_328.m_backend.data._M_elems[7]._1_3_ = local_568.m_backend.data._M_elems[7]._1_3_;
            local_328.m_backend.data._M_elems._24_5_ = local_568.m_backend.data._M_elems._24_5_;
            local_328.m_backend.data._M_elems[4] = local_568.m_backend.data._M_elems[4];
            local_328.m_backend.data._M_elems[5] = local_568.m_backend.data._M_elems[5];
            local_328.m_backend.data._M_elems[0] = local_568.m_backend.data._M_elems[0];
            local_328.m_backend.data._M_elems[1] = local_568.m_backend.data._M_elems[1];
            local_328.m_backend.data._M_elems[2] = local_568.m_backend.data._M_elems[2];
            local_328.m_backend.data._M_elems[3] = local_568.m_backend.data._M_elems[3];
            local_328.m_backend.exp = local_568.m_backend.exp;
            local_328.m_backend.neg = local_568.m_backend.neg;
            local_328.m_backend.fpclass = local_568.m_backend.fpclass;
            local_328.m_backend.prec_elem = local_568.m_backend.prec_elem;
            pnVar10 = &local_4a8;
            pnVar11 = &local_328;
          }
          else {
            local_2e8.m_backend.data._M_elems[9]._1_3_ = local_568.m_backend.data._M_elems[9]._1_3_;
            local_2e8.m_backend.data._M_elems._32_5_ = local_568.m_backend.data._M_elems._32_5_;
            local_2e8.m_backend.data._M_elems[7]._1_3_ = local_568.m_backend.data._M_elems[7]._1_3_;
            local_2e8.m_backend.data._M_elems._24_5_ = local_568.m_backend.data._M_elems._24_5_;
            local_2e8.m_backend.data._M_elems[4] = local_568.m_backend.data._M_elems[4];
            local_2e8.m_backend.data._M_elems[5] = local_568.m_backend.data._M_elems[5];
            local_2e8.m_backend.data._M_elems[0] = local_568.m_backend.data._M_elems[0];
            local_2e8.m_backend.data._M_elems[1] = local_568.m_backend.data._M_elems[1];
            local_2e8.m_backend.data._M_elems[2] = local_568.m_backend.data._M_elems[2];
            local_2e8.m_backend.data._M_elems[3] = local_568.m_backend.data._M_elems[3];
            local_2e8.m_backend.exp = local_568.m_backend.exp;
            local_2e8.m_backend.neg = local_568.m_backend.neg;
            local_2e8.m_backend.fpclass = local_568.m_backend.fpclass;
            local_2e8.m_backend.prec_elem = local_568.m_backend.prec_elem;
            pnVar10 = &local_68;
            pnVar11 = &local_2e8;
          }
          local_570 = (DataKey)minSelect(this,&local_574,&local_3e8,pnVar10,
                                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_428,pnVar11);
          local_468.fpclass = cpp_dec_float_finite;
          local_468.prec_elem = 10;
          local_468.data._M_elems[0] = 0;
          local_468.data._M_elems[1] = 0;
          local_468.data._M_elems[2] = 0;
          local_468.data._M_elems[3] = 0;
          local_468.data._M_elems[4] = 0;
          local_468.data._M_elems[5] = 0;
          local_468.data._M_elems._24_5_ = 0;
          local_468.data._M_elems[7]._1_3_ = 0;
          local_468.data._M_elems._32_5_ = 0;
          local_468.data._M_elems[9]._1_3_ = 0;
          local_468.exp = 0;
          local_468.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&local_4e8,2,(type *)0x0);
          local_468.data._M_elems._32_5_ = _local_388;
          local_468.data._M_elems[9]._1_3_ = uStack_383;
          local_468.data._M_elems[4] = auStack_3a0[2];
          local_468.data._M_elems[5] = auStack_3a0[3];
          local_468.data._M_elems._24_5_ = stack0xfffffffffffffc70;
          local_468.data._M_elems[7]._1_3_ = uStack_38b;
          local_468.data._M_elems[0] = (uint)local_3a8;
          local_468.data._M_elems[1] = local_3a8._4_4_;
          local_468.data._M_elems[2] = auStack_3a0[0];
          local_468.data._M_elems[3] = auStack_3a0[1];
          local_468.exp = local_380;
          local_468.neg = (bool)local_37c;
          local_468.fpclass = (fpclass_type)local_378;
          local_468.prec_elem = local_378._4_4_;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_468,&local_4e8);
          iVar9 = 2;
          if ((local_428.fpclass != cpp_dec_float_NaN) && (local_468.fpclass != cpp_dec_float_NaN))
          {
            iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_428,&local_468);
            iVar9 = (iVar9 >> 0x1f) + 2;
          }
          iVar8 = iVar8 + iVar9;
        }
        local_368.m_backend.data._M_elems[9]._1_3_ = uStack_503;
        local_368.m_backend.data._M_elems._32_5_ = local_508;
        local_368.m_backend.data._M_elems[7]._1_3_ = uStack_50b;
        local_368.m_backend.data._M_elems._24_5_ = uStack_510;
        local_368.m_backend.data._M_elems[4] = auStack_520[2];
        local_368.m_backend.data._M_elems[5] = auStack_520[3];
        local_368.m_backend.data._M_elems[0] = (uint)local_528;
        local_368.m_backend.data._M_elems[1] = local_528._4_4_;
        local_368.m_backend.data._M_elems[2] = auStack_520[0];
        local_368.m_backend.data._M_elems[3] = auStack_520[1];
        local_368.m_backend.exp = local_500;
        local_368.m_backend.neg = (bool)local_4fc;
        local_368.m_backend.fpclass = (fpclass_type)local_4f8;
        local_368.m_backend.prec_elem = local_4f8._4_4_;
        bVar7 = minReEnter(this,&local_3e8,&local_368,(SPxId *)&local_570,local_574,bVar6);
      } while ((bVar7) && (relax(this), iVar8 < 2));
    }
  }
  else {
    iVar8 = 0;
    do {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_528,0.0);
      local_568.m_backend.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
      local_568.m_backend.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
      local_568.m_backend.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4)
      ;
      uVar5 = *(undefined8 *)((val->m_backend).data._M_elems + 6);
      local_568.m_backend.data._M_elems._24_5_ = SUB85(uVar5,0);
      local_568.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
      uVar5 = *(undefined8 *)((val->m_backend).data._M_elems + 8);
      local_568.m_backend.data._M_elems._32_5_ = SUB85(uVar5,0);
      local_568.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
      local_568.m_backend.exp = (val->m_backend).exp;
      local_568.m_backend.neg = (val->m_backend).neg;
      local_568.m_backend.fpclass = (val->m_backend).fpclass;
      local_568.m_backend.prec_elem = (val->m_backend).prec_elem;
      local_570 = (DataKey)maxDelta(this,&local_574,&local_568,
                                    (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&local_528);
      if (local_570.info == 0) goto LAB_002b2ad7;
      local_a8.m_backend.data._M_elems[7]._1_3_ = local_568.m_backend.data._M_elems[7]._1_3_;
      local_a8.m_backend.data._M_elems._24_5_ = local_568.m_backend.data._M_elems._24_5_;
      local_a8.m_backend.data._M_elems[0] = local_568.m_backend.data._M_elems[0];
      local_a8.m_backend.data._M_elems[1] = local_568.m_backend.data._M_elems[1];
      local_a8.m_backend.data._M_elems[2] = local_568.m_backend.data._M_elems[2];
      local_a8.m_backend.data._M_elems[3] = local_568.m_backend.data._M_elems[3];
      local_a8.m_backend.data._M_elems[4] = local_568.m_backend.data._M_elems[4];
      local_a8.m_backend.data._M_elems[5] = local_568.m_backend.data._M_elems[5];
      local_a8.m_backend.data._M_elems[9]._1_3_ = local_568.m_backend.data._M_elems[9]._1_3_;
      local_a8.m_backend.data._M_elems._32_5_ = local_568.m_backend.data._M_elems._32_5_;
      local_a8.m_backend.exp = local_568.m_backend.exp;
      local_a8.m_backend.neg = local_568.m_backend.neg;
      local_a8.m_backend.fpclass = local_568.m_backend.fpclass;
      local_a8.m_backend.prec_elem = local_568.m_backend.prec_elem;
      local_e8.m_backend.data._M_elems[7]._1_3_ = uStack_50b;
      local_e8.m_backend.data._M_elems._24_5_ = uStack_510;
      local_e8.m_backend.data._M_elems[0] = (uint)local_528;
      local_e8.m_backend.data._M_elems[1] = local_528._4_4_;
      local_e8.m_backend.data._M_elems[2] = auStack_520[0];
      local_e8.m_backend.data._M_elems[3] = auStack_520[1];
      local_e8.m_backend.data._M_elems[4] = auStack_520[2];
      local_e8.m_backend.data._M_elems[5] = auStack_520[3];
      local_e8.m_backend.data._M_elems[9]._1_3_ = uStack_503;
      local_e8.m_backend.data._M_elems._32_5_ = local_508;
      local_e8.m_backend.exp = local_500;
      local_e8.m_backend.neg = (bool)local_4fc;
      local_e8.m_backend.fpclass = (fpclass_type)local_4f8;
      local_e8.m_backend.prec_elem = local_4f8._4_4_;
      bVar6 = shortEnter(this,(SPxId *)&local_570,local_574,&local_a8,&local_e8);
      if (!bVar6) {
        local_428.fpclass = cpp_dec_float_finite;
        local_428.prec_elem = 10;
        local_428.data._M_elems[0] = 0;
        local_428.data._M_elems[1] = 0;
        local_428.data._M_elems[2] = 0;
        local_428.data._M_elems[3] = 0;
        local_428.data._M_elems[4] = 0;
        local_428.data._M_elems[5] = 0;
        local_428.data._M_elems._24_5_ = 0;
        local_428.data._M_elems[7]._1_3_ = 0;
        local_428.data._M_elems._32_5_ = 0;
        local_428.data._M_elems[9]._1_3_ = 0;
        local_428.exp = 0;
        local_428.neg = false;
        local_4a8.m_backend.fpclass = cpp_dec_float_finite;
        local_4a8.m_backend.prec_elem = 10;
        local_4a8.m_backend.data._M_elems[0] = 0;
        local_4a8.m_backend.data._M_elems[1] = 0;
        local_4a8.m_backend.data._M_elems[2] = 0;
        local_4a8.m_backend.data._M_elems[3] = 0;
        local_4a8.m_backend.data._M_elems[4] = 0;
        local_4a8.m_backend.data._M_elems[5] = 0;
        local_4a8.m_backend.data._M_elems._24_5_ = 0;
        local_4a8.m_backend.data._M_elems[7]._1_3_ = 0;
        local_4a8.m_backend.data._M_elems._32_5_ = 0;
        local_4a8.m_backend.data._M_elems[9]._1_3_ = 0;
        local_4a8.m_backend.exp = 0;
        local_4a8.m_backend.neg = false;
        local_128.m_backend.data._M_elems[7]._1_3_ = uStack_50b;
        local_128.m_backend.data._M_elems._24_5_ = uStack_510;
        local_128.m_backend.data._M_elems[0] = (uint)local_528;
        local_128.m_backend.data._M_elems[1] = local_528._4_4_;
        local_128.m_backend.data._M_elems[2] = auStack_520[0];
        local_128.m_backend.data._M_elems[3] = auStack_520[1];
        local_128.m_backend.data._M_elems[4] = auStack_520[2];
        local_128.m_backend.data._M_elems[5] = auStack_520[3];
        local_128.m_backend.data._M_elems[9]._1_3_ = uStack_503;
        local_128.m_backend.data._M_elems._32_5_ = local_508;
        local_128.m_backend.exp = local_500;
        local_128.m_backend.neg = (bool)local_4fc;
        local_128.m_backend.fpclass = (fpclass_type)local_4f8;
        local_128.m_backend.prec_elem = local_4f8._4_4_;
        minStability((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_4e8,this,&local_128);
        local_4a8.m_backend.data._M_elems._32_5_ = local_4e8.data._M_elems._32_5_;
        local_4a8.m_backend.data._M_elems[9]._1_3_ = local_4e8.data._M_elems[9]._1_3_;
        local_4a8.m_backend.data._M_elems[4] = local_4e8.data._M_elems[4];
        local_4a8.m_backend.data._M_elems[5] = local_4e8.data._M_elems[5];
        local_4a8.m_backend.data._M_elems._24_5_ = local_4e8.data._M_elems._24_5_;
        local_4a8.m_backend.data._M_elems[7]._1_3_ = local_4e8.data._M_elems[7]._1_3_;
        local_4a8.m_backend.data._M_elems[0] = local_4e8.data._M_elems[0];
        local_4a8.m_backend.data._M_elems[1] = local_4e8.data._M_elems[1];
        local_4a8.m_backend.data._M_elems[2] = local_4e8.data._M_elems[2];
        local_4a8.m_backend.data._M_elems[3] = local_4e8.data._M_elems[3];
        local_4a8.m_backend.exp = local_4e8.exp;
        local_4a8.m_backend.neg = local_4e8.neg;
        local_4a8.m_backend.fpclass = local_4e8.fpclass;
        local_4a8.m_backend.prec_elem = local_4e8.prec_elem;
        if (cVar2 == '\0') {
          local_1a8.m_backend.data._M_elems[9]._1_3_ = local_568.m_backend.data._M_elems[9]._1_3_;
          local_1a8.m_backend.data._M_elems._32_5_ = local_568.m_backend.data._M_elems._32_5_;
          local_1a8.m_backend.data._M_elems[7]._1_3_ = local_568.m_backend.data._M_elems[7]._1_3_;
          local_1a8.m_backend.data._M_elems._24_5_ = local_568.m_backend.data._M_elems._24_5_;
          local_1a8.m_backend.data._M_elems[4] = local_568.m_backend.data._M_elems[4];
          local_1a8.m_backend.data._M_elems[5] = local_568.m_backend.data._M_elems[5];
          local_1a8.m_backend.data._M_elems[0] = local_568.m_backend.data._M_elems[0];
          local_1a8.m_backend.data._M_elems[1] = local_568.m_backend.data._M_elems[1];
          local_1a8.m_backend.data._M_elems[2] = local_568.m_backend.data._M_elems[2];
          local_1a8.m_backend.data._M_elems[3] = local_568.m_backend.data._M_elems[3];
          local_1a8.m_backend.exp = local_568.m_backend.exp;
          local_1a8.m_backend.neg = local_568.m_backend.neg;
          local_1a8.m_backend.fpclass = local_568.m_backend.fpclass;
          local_1a8.m_backend.prec_elem = local_568.m_backend.prec_elem;
          pnVar10 = &local_4a8;
          pnVar11 = &local_1a8;
        }
        else {
          local_168.m_backend.data._M_elems[9]._1_3_ = local_568.m_backend.data._M_elems[9]._1_3_;
          local_168.m_backend.data._M_elems._32_5_ = local_568.m_backend.data._M_elems._32_5_;
          local_168.m_backend.data._M_elems[7]._1_3_ = local_568.m_backend.data._M_elems[7]._1_3_;
          local_168.m_backend.data._M_elems._24_5_ = local_568.m_backend.data._M_elems._24_5_;
          local_168.m_backend.data._M_elems[4] = local_568.m_backend.data._M_elems[4];
          local_168.m_backend.data._M_elems[5] = local_568.m_backend.data._M_elems[5];
          local_168.m_backend.data._M_elems[0] = local_568.m_backend.data._M_elems[0];
          local_168.m_backend.data._M_elems[1] = local_568.m_backend.data._M_elems[1];
          local_168.m_backend.data._M_elems[2] = local_568.m_backend.data._M_elems[2];
          local_168.m_backend.data._M_elems[3] = local_568.m_backend.data._M_elems[3];
          local_168.m_backend.exp = local_568.m_backend.exp;
          local_168.m_backend.neg = local_568.m_backend.neg;
          local_168.m_backend.fpclass = local_568.m_backend.fpclass;
          local_168.m_backend.prec_elem = local_568.m_backend.prec_elem;
          pnVar10 = &local_68;
          pnVar11 = &local_168;
        }
        local_570 = (DataKey)maxSelect(this,&local_574,&local_3e8,pnVar10,
                                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_428,pnVar11);
        local_468.fpclass = cpp_dec_float_finite;
        local_468.prec_elem = 10;
        local_468.data._M_elems[0] = 0;
        local_468.data._M_elems[1] = 0;
        local_468.data._M_elems[2] = 0;
        local_468.data._M_elems[3] = 0;
        local_468.data._M_elems[4] = 0;
        local_468.data._M_elems[5] = 0;
        local_468.data._M_elems._24_5_ = 0;
        local_468.data._M_elems[7]._1_3_ = 0;
        local_468.data._M_elems._32_5_ = 0;
        local_468.data._M_elems[9]._1_3_ = 0;
        local_468.exp = 0;
        local_468.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_4e8,2,(type *)0x0);
        local_468.data._M_elems._32_5_ = _local_388;
        local_468.data._M_elems[9]._1_3_ = uStack_383;
        local_468.data._M_elems[4] = auStack_3a0[2];
        local_468.data._M_elems[5] = auStack_3a0[3];
        local_468.data._M_elems._24_5_ = stack0xfffffffffffffc70;
        local_468.data._M_elems[7]._1_3_ = uStack_38b;
        local_468.data._M_elems[0] = (uint)local_3a8;
        local_468.data._M_elems[1] = local_3a8._4_4_;
        local_468.data._M_elems[2] = auStack_3a0[0];
        local_468.data._M_elems[3] = auStack_3a0[1];
        local_468.exp = local_380;
        local_468.neg = (bool)local_37c;
        local_468.fpclass = (fpclass_type)local_378;
        local_468.prec_elem = local_378._4_4_;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_468,&local_4e8);
        iVar9 = 2;
        if ((local_428.fpclass != cpp_dec_float_NaN) && (local_468.fpclass != cpp_dec_float_NaN)) {
          iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_428,&local_468);
          iVar9 = (iVar9 >> 0x1f) + 2;
        }
        iVar8 = iVar8 + iVar9;
      }
      local_1e8.m_backend.data._M_elems[9]._1_3_ = uStack_503;
      local_1e8.m_backend.data._M_elems._32_5_ = local_508;
      local_1e8.m_backend.data._M_elems[7]._1_3_ = uStack_50b;
      local_1e8.m_backend.data._M_elems._24_5_ = uStack_510;
      local_1e8.m_backend.data._M_elems[4] = auStack_520[2];
      local_1e8.m_backend.data._M_elems[5] = auStack_520[3];
      local_1e8.m_backend.data._M_elems[0] = (uint)local_528;
      local_1e8.m_backend.data._M_elems[1] = local_528._4_4_;
      local_1e8.m_backend.data._M_elems[2] = auStack_520[0];
      local_1e8.m_backend.data._M_elems[3] = auStack_520[1];
      local_1e8.m_backend.exp = local_500;
      local_1e8.m_backend.neg = (bool)local_4fc;
      local_1e8.m_backend.fpclass = (fpclass_type)local_4f8;
      local_1e8.m_backend.prec_elem = local_4f8._4_4_;
      bVar6 = maxReEnter(this,&local_3e8,&local_1e8,(SPxId *)&local_570,local_574,polish);
    } while ((bVar6) && (relax(this), iVar8 < 2));
  }
  if (((char)local_52c != '\0') && (local_570.info != 0)) {
    this_00 = (this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver;
    if (this_00->polishObj == POLISH_FRACTIONALITY) {
      if ((this_00->integerVariables).thesize ==
          (this_00->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
        if ((0 < local_570.info) &&
           (iVar8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::number(&this_00->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ,(SPxId *)&local_570), (this_00->integerVariables).data[iVar8] == 1)) {
LAB_002b2af9:
          local_570.info = 0;
          local_570.idx = 0;
          uVar12 = 0xffffffff00000000;
          goto LAB_002b2ada;
        }
      }
      else if (0 < local_570.info) goto LAB_002b2af9;
    }
    else if ((this_00->polishObj == POLISH_INTEGRALITY) &&
            ((local_570.info < 0 ||
             (((this_00->integerVariables).thesize ==
               (this_00->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum &&
              (iVar8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::number(&this_00->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ,(SPxId *)&local_570), (this_00->integerVariables).data[iVar8] == 0)
              ))))) goto LAB_002b2af9;
  }
  if (local_570.info == 0) {
    uVar5 = *(undefined8 *)((local_3b0->m_backend).data._M_elems + 8);
    local_4a8.m_backend.data._M_elems._32_5_ = SUB85(uVar5,0);
    local_4a8.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
    local_4a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_3b0->m_backend).data._M_elems;
    local_4a8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((local_3b0->m_backend).data._M_elems + 2);
    local_4a8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((local_3b0->m_backend).data._M_elems + 4);
    uVar5 = *(undefined8 *)((local_3b0->m_backend).data._M_elems + 6);
    local_4a8.m_backend.data._M_elems._24_5_ = SUB85(uVar5,0);
    local_4a8.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
    iVar8 = (this->epsilon).m_backend.exp;
    bVar6 = (this->epsilon).m_backend.neg;
    local_428.fpclass = cpp_dec_float_finite;
    local_428.prec_elem = 10;
    local_428.data._M_elems[0] = 0;
    local_428.data._M_elems[1] = 0;
    local_428.data._M_elems[2] = 0;
    local_428.data._M_elems[3] = 0;
    local_428.data._M_elems[4] = 0;
    local_428.data._M_elems[5] = 0;
    local_428.data._M_elems._24_5_ = 0;
    local_428.data._M_elems[7]._1_3_ = 0;
    local_428.data._M_elems._32_5_ = 0;
    local_428.data._M_elems[9]._1_3_ = 0;
    local_428.exp = 0;
    local_428.neg = false;
    uVar5._0_4_ = (this->epsilon).m_backend.fpclass;
    uVar5._4_4_ = (this->epsilon).m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_4e8,2,(type *)0x0);
    local_428.data._M_elems._32_5_ = local_4a8.m_backend.data._M_elems._32_5_;
    local_428.data._M_elems[9]._1_3_ = local_4a8.m_backend.data._M_elems[9]._1_3_;
    local_428.data._M_elems[4] = local_4a8.m_backend.data._M_elems[4];
    local_428.data._M_elems[5] = local_4a8.m_backend.data._M_elems[5];
    local_428.data._M_elems._24_5_ = local_4a8.m_backend.data._M_elems._24_5_;
    local_428.data._M_elems[7]._1_3_ = local_4a8.m_backend.data._M_elems[7]._1_3_;
    local_428.data._M_elems[0] = local_4a8.m_backend.data._M_elems[0];
    local_428.data._M_elems[1] = local_4a8.m_backend.data._M_elems[1];
    local_428.data._M_elems[2] = local_4a8.m_backend.data._M_elems[2];
    local_428.data._M_elems[3] = local_4a8.m_backend.data._M_elems[3];
    local_428.exp = iVar8;
    local_428.neg = bVar6;
    local_428._48_8_ = uVar5;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&local_428,&local_4e8);
    if ((((this->minStab).m_backend.fpclass != cpp_dec_float_NaN) &&
        (local_428.fpclass != cpp_dec_float_NaN)) &&
       (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&(this->minStab).m_backend,&local_428), 0 < iVar8)) goto LAB_002b2972;
  }
  else {
LAB_002b2972:
    *(ulong *)((val->m_backend).data._M_elems + 8) =
         CONCAT35(local_3e8.m_backend.data._M_elems[9]._1_3_,
                  local_3e8.m_backend.data._M_elems._32_5_);
    *(undefined8 *)((val->m_backend).data._M_elems + 4) = local_3e8.m_backend.data._M_elems._16_8_;
    *(ulong *)((val->m_backend).data._M_elems + 6) =
         CONCAT35(local_3e8.m_backend.data._M_elems[7]._1_3_,
                  local_3e8.m_backend.data._M_elems._24_5_);
    *(undefined8 *)(val->m_backend).data._M_elems = local_3e8.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 2) = local_3e8.m_backend.data._M_elems._8_8_;
    (val->m_backend).exp = local_3e8.m_backend.exp;
    (val->m_backend).neg = local_3e8.m_backend.neg;
    (val->m_backend).fpclass = local_3e8.m_backend.fpclass;
    (val->m_backend).prec_elem = local_3e8.m_backend.prec_elem;
    if (local_570.info != 0) {
      tighten(this);
    }
  }
LAB_002b2ad7:
  uVar12 = (ulong)local_570 & 0xffffffff00000000;
LAB_002b2ada:
  return (SPxId)((ulong)local_570 & 0xffffffff | uVar12);
}

Assistant:

SPxId SPxFastRT<R>::selectEnter(R& val, int, bool polish)
{
   SPxId enterId;
   R max, sel;
   R maxabs = 0.0;
   R delta_shift = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_DELTA_SHIFT);
   int nr;
   int cnt = 0;

   assert(this->m_type == SPxSolverBase<R>::LEAVE);

   resetTols();

   // force instable pivot iff true (see explanation in leave.hpp and spxsolve.hpp)
   bool instable = this->solver()->instableLeave;
   R lowstab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_LOWSTAB);
   assert(!instable || this->solver()->instableLeaveNum >= 0);

   sel = 0.0;

   if(val > epsilonZero())
   {
      do
      {
         maxabs = 0.0;
         max = val;

         enterId = maxDelta(nr, max, maxabs);

         if(!enterId.isValid())
            return enterId;

         assert(max >= 0.0);
         assert(!enterId.isValid() || !this->solver()->isBasic(enterId));

         if(!shortEnter(enterId, nr, max, maxabs))
         {
            R bestDelta, stab;

            stab = minStability(maxabs);

            // force instable pivot iff instable is true (see explanation in leave.hpp and spxsolve.hpp)
            if(instable)
            {
               enterId = maxSelect(nr, sel, lowstab, bestDelta, max);
            }
            else
            {
               enterId = maxSelect(nr, sel, stab, bestDelta, max);
            }

            if(bestDelta < delta_shift * SOPLEX_TRIES)
               cnt++;
            else
               cnt += SOPLEX_TRIES;
         }

         if(!maxReEnter(sel, maxabs, enterId, nr, polish))
            break;

         relax();
      }
      while(cnt < SOPLEX_TRIES);
   }
   else if(val < -epsilonZero())
   {
      do
      {
         maxabs = 0.0;
         max = val;
         enterId = minDelta(nr, max, maxabs);

         if(!enterId.isValid())
            return enterId;

         assert(max <= 0.0);
         assert(!enterId.isValid() || !this->solver()->isBasic(enterId));

         if(!shortEnter(enterId, nr, max, maxabs))
         {
            R bestDelta, stab;

            stab = minStability(maxabs);

            // force instable pivot iff instable is true (see explanation in leave.hpp and spxsolve.hpp)
            if(instable)
            {
               enterId = minSelect(nr, sel, lowstab, bestDelta, max);
            }
            else
            {
               enterId = minSelect(nr, sel, stab, bestDelta, max);
            }

            if(bestDelta < delta_shift * SOPLEX_TRIES)
               cnt++;
            else
               cnt += SOPLEX_TRIES;
         }

         if(!minReEnter(sel, maxabs, enterId, nr, polish))
            break;

         relax();
      }
      while(cnt < SOPLEX_TRIES);
   }

   SPX_DEBUG(

      if(enterId.isValid())
{
   assert(!enterId.isValid() || !this->solver()->isBasic(enterId));

      R x;

      if(this->thesolver->isCoId(enterId))
         x = this->thesolver->coPvec().delta()[ this->thesolver->number(enterId) ];
      else
         x = this->thesolver->pVec().delta()[ this->thesolver->number(enterId) ];

      std::cout << "DFSTRT03 " << this->thesolver->basis().iteration() << ": "
                << sel << '\t' << x << " (" << maxabs << ")" << std::endl;
   }
   else
      std::cout << "DFSTRT04 " << this->thesolver->basis().iteration()
                << ": skipping instable pivot" << std::endl;
      )

      if(polish && enterId.isValid())
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::ROW);

         // decide whether the chosen entering index contributes to the polishing objective
         if(this->thesolver->polishObj == SPxSolverBase<R>::POLISH_INTEGRALITY)
         {
            // only allow (integer) variables to enter the basis
            if(enterId.isSPxRowId())
               return SPxId();
            else if(this->thesolver->integerVariables.size() == this->thesolver->nCols()
                    && this->thesolver->integerVariables[this->thesolver->number(enterId)] == 0)
               return SPxId();
         }
         else if(this->thesolver->polishObj == SPxSolverBase<R>::POLISH_FRACTIONALITY)
         {
            // only allow slacks and continuous variables to enter the basis
            if(this->thesolver->integerVariables.size() == this->thesolver->nCols())
            {
               if(enterId.isSPxColId() && this->thesolver->integerVariables[this->thesolver->number(enterId)] == 1)
                  return SPxId();
            }
            else if(enterId.isSPxColId())
               return SPxId();
         }
      }


   if(enterId.isValid() || minStab > 2 * epsilonZero())
   {
      val = sel;

      if(enterId.isValid())
         tighten();
   }

   assert(!enterId.isValid() || !this->solver()->isBasic(enterId));

   return enterId;
}